

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::add_implied_read_expression
          (Compiler *this,SPIRAccessChain *e,uint32_t source)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  
  pTVar2 = (e->implied_read_expressions).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar2 = ::std::
           __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                     (pTVar2,pTVar2 + (e->implied_read_expressions).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                      .buffer_size);
  sVar1 = (e->implied_read_expressions).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (pTVar2 == (e->implied_read_expressions).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr + sVar1) {
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
              (&e->implied_read_expressions,sVar1 + 1);
    sVar1 = (e->implied_read_expressions).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    (e->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
    [sVar1].id = source;
    (e->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
    buffer_size = sVar1 + 1;
  }
  return;
}

Assistant:

void Compiler::add_implied_read_expression(SPIRAccessChain &e, uint32_t source)
{
	auto itr = find(begin(e.implied_read_expressions), end(e.implied_read_expressions), ID(source));
	if (itr == end(e.implied_read_expressions))
		e.implied_read_expressions.push_back(source);
}